

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O2

int compare_zip(char **zn)

{
  undefined8 *puVar1;
  char **ppcVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  zip_uint32_t zVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  entry *peVar11;
  char *pcVar12;
  FILE *__stream;
  size_t sVar13;
  zip_t *pzVar14;
  ulong uVar15;
  ef *__base;
  long lVar16;
  undefined8 uVar17;
  int *piVar18;
  char *pcVar19;
  undefined8 uVar20;
  char *pcVar21;
  code *check;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  entry *peVar25;
  char *pcVar26;
  zip_uint64_t zVar27;
  bool bVar28;
  ulong local_2120;
  ulong local_2118;
  int err;
  char **local_20e8;
  char **local_20e0;
  zip_uint64_t n [2];
  zip_uint64_t local_20c0;
  zip_uint32_t local_20a8;
  ushort local_20a4;
  archive a [2];
  entry *e [2];
  uint local_2020;
  
  lVar24 = 0;
  local_20e8 = zn;
LAB_0010250b:
  ppcVar2 = local_20e8;
  if (lVar24 != 2) {
    pcVar12 = local_20e8[lVar24];
    a[lVar24].name = pcVar12;
    a[lVar24].za = (zip_t *)0x0;
    a[lVar24].nentry = 0;
    a[lVar24].entry = (entry *)0x0;
    a[lVar24].comment = (char *)0x0;
    a[lVar24].comment_length = 0;
    iVar5 = stat(pcVar12,(stat *)e);
    pcVar12 = ppcVar2[lVar24];
    if ((-1 < iVar5) && ((local_2020 & 0xf000) == 0x4000)) {
      n[1] = 0;
      n[0] = (zip_uint64_t)pcVar12;
      lVar8 = fts_open(n,6,0);
      uVar20 = _stderr;
      pcVar26 = progname;
      if (lVar8 != 0) {
        sVar9 = strlen(pcVar12);
        peVar11 = (entry *)0x0;
        local_2120 = 0;
        local_2118 = 0;
LAB_001025bd:
        do {
          lVar10 = fts_read(lVar8);
          if (lVar10 == 0) goto LAB_00102b03;
          uVar3 = *(ushort *)(lVar10 + 0x62);
          if (uVar3 < 0xe) {
            if (uVar3 == 8) {
              if (local_2118 <= local_2120) {
                local_2118 = local_2118 + 0x10;
                if (0x492492492492492 < local_2118) goto LAB_00102c88;
                peVar11 = (entry *)realloc(peVar11,local_2118 * 0x38);
                a[lVar24].entry = peVar11;
                if (peVar11 == (entry *)0x0) goto LAB_00102c88;
              }
              pcVar12 = strdup((char *)(*(long *)(lVar10 + 0x30) + sVar9 + 1));
              peVar11[local_2120].name = pcVar12;
              peVar11[local_2120].size = *(zip_uint64_t *)(*(long *)(lVar10 + 0x68) + 0x30);
              pcVar12 = *(char **)(lVar10 + 0x28);
              lVar10 = crc32(0,0,0);
              __stream = fopen(pcVar12,"rb");
              uVar20 = _stderr;
              pcVar26 = progname;
              if (__stream == (FILE *)0x0) {
                piVar18 = __errno_location();
                pcVar19 = strerror(*piVar18);
                zip_fclose(uVar20,"%s: can\'t open %s: %s\n",pcVar26,pcVar12,pcVar19);
              }
              else {
                while (sVar13 = fread((stat *)e,1,0x2000,__stream), sVar13 != 0) {
                  lVar10 = crc32(lVar10,(stat *)e,sVar13 & 0xffffffff);
                }
                iVar5 = ferror(__stream);
                uVar20 = _stderr;
                pcVar26 = progname;
                if (iVar5 == 0) {
                  fclose(__stream);
                  if (-1 < lVar10) {
                    peVar11[local_2120].crc = (zip_uint32_t)lVar10;
                    local_2120 = local_2120 + 1;
                    a[lVar24].nentry = local_2120;
                    goto LAB_001025bd;
                  }
                }
                else {
                  piVar18 = __errno_location();
                  pcVar19 = strerror(*piVar18);
                  zip_fclose(uVar20,"%s: read error on %s: %s\n",pcVar26,pcVar12,pcVar19);
                  fclose(__stream);
                }
              }
            }
            else if ((0x2494U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001025bd;
            fts_close(lVar8);
            goto LAB_00102c80;
          }
        } while( true );
      }
      piVar18 = __errno_location();
      pcVar19 = strerror(*piVar18);
      pcVar21 = "%s: can\'t open directory \'%s\': %s\n";
      goto LAB_00102be4;
    }
    pzVar14 = (zip_t *)zip_open(pcVar12,(ulong)(paranoid != 0) << 2,&err);
    if (pzVar14 == (zip_t *)0x0) {
      zip_error_init_with_code(e,err);
      uVar20 = _stderr;
      pcVar26 = progname;
      uVar17 = zip_error_strerror(e);
      zip_fclose(uVar20,"%s: cannot open zip archive \'%s\': %s\n",pcVar26,pcVar12,uVar17);
      zip_error_fini(e);
      goto LAB_00102c80;
    }
    a[lVar24].za = pzVar14;
    local_2120 = zip_get_num_entries(pzVar14,0);
    a[lVar24].nentry = local_2120;
    if (local_2120 == 0) {
      a[lVar24].entry = (entry *)0x0;
      peVar11 = (entry *)0x0;
      local_2120 = 0;
      goto LAB_00102b70;
    }
    if (local_2120 < 0x492492492492493) {
      peVar11 = (entry *)malloc(local_2120 * 0x38);
      a[lVar24].entry = peVar11;
      if (peVar11 != (entry *)0x0) {
        local_20e0 = &a[lVar24].comment;
        for (uVar22 = 0; uVar23 = (ulong)uVar22, uVar23 < local_2120; uVar22 = uVar22 + 1) {
          zip_stat_index(pzVar14,uVar23,0,n);
          pcVar12 = strdup((char *)n[1]);
          peVar11[uVar23].name = pcVar12;
          peVar11[uVar23].size = local_20c0;
          peVar11[uVar23].crc = local_20a8;
          if (test_files != 0) {
            lVar8 = zip_fopen_index(pzVar14,uVar23,0);
            uVar20 = _stderr;
            pcVar12 = progname;
            if (lVar8 == 0) {
              uVar17 = zip_strerror(pzVar14);
              zip_fclose(uVar20,"%s: cannot open file %lu in archive: %s\n",pcVar12,uVar23,uVar17);
            }
            else {
              zVar6 = crc32(0,0,0);
              zVar27 = 0;
              while( true ) {
                uVar15 = zip_fread(lVar8,(stat *)e,0x2000);
                uVar20 = _stderr;
                pcVar12 = progname;
                if ((long)uVar15 < 1) break;
                zVar27 = zVar27 + uVar15;
                zVar6 = crc32(zVar6,(stat *)e,uVar15 & 0xffffffff);
              }
              if ((long)uVar15 < 0) {
                uVar17 = zip_file_strerror(lVar8);
                zip_fclose(uVar20,"%s: error reading file %lu in archive: %s\n",pcVar12,uVar23,
                           uVar17);
                zip_fclose(lVar8);
              }
              else {
                zip_fclose(lVar8);
                if (zVar27 == local_20c0) {
                  if (local_20a8 != zVar6) {
                    zip_fclose(_stderr,"%s: file %lu: unexpected length %x (should be %x)\n",
                               progname,uVar23,zVar6);
                  }
                }
                else {
                  zip_fclose(_stderr,"%s: file %lu: unexpected length %ld (should be %ld)\n",
                             progname,uVar23,zVar27);
                }
              }
            }
          }
          if (paranoid == 0) {
            peVar11[uVar23].comp_method = 0;
            peVar11[uVar23].n_extra_fields = 0;
          }
          else {
            peVar11[uVar23].comp_method = (uint)local_20a4;
            uVar3 = zip_file_extra_fields_count(pzVar14,uVar23,0x100);
            if ((-1 < (short)uVar3) &&
               (sVar4 = zip_file_extra_fields_count(pzVar14,uVar23,0x200), -1 < sVar4)) {
              peVar11 = peVar11 + uVar23;
              peVar11->n_extra_fields = sVar4 + uVar3;
              __base = (ef *)malloc((ulong)(ushort)(sVar4 + uVar3) * 0x18);
              peVar11->extra_fields = __base;
              if (__base != (ef *)0x0) {
                lVar10 = (ulong)uVar3 * 0x18;
                sVar4 = 0;
                for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
                  puVar1 = (undefined8 *)((long)&__base->name + lVar8);
                  *puVar1 = peVar11->name;
                  lVar16 = zip_file_extra_field_get
                                     (pzVar14,uVar23,sVar4,(long)puVar1 + 10,
                                      (long)&__base->size + lVar8);
                  __base = peVar11->extra_fields;
                  *(long *)((long)&__base->data + lVar8) = lVar16;
                  if (lVar16 == 0) goto LAB_001029fc;
                  *(undefined2 *)((long)&__base->flags + lVar8) = 0x100;
                  sVar4 = sVar4 + 1;
                }
                for (uVar15 = 0; uVar3 + uVar15 < (ulong)peVar11->n_extra_fields;
                    uVar15 = uVar15 + 1) {
                  puVar1 = (undefined8 *)((long)&__base->name + lVar10);
                  *puVar1 = peVar11->name;
                  lVar8 = zip_file_extra_field_get
                                    (pzVar14,uVar23,uVar15 & 0xffff,(long)puVar1 + 10,
                                     (long)&__base->size + lVar10);
                  __base = peVar11->extra_fields;
                  *(long *)((long)&__base->data + lVar10) = lVar8;
                  if (lVar8 == 0) goto LAB_001029fc;
                  *(undefined2 *)((long)&__base->flags + lVar10) = 0x200;
                  lVar10 = lVar10 + 0x18;
                }
                qsort(__base,(ulong)peVar11->n_extra_fields,0x18,ef_order);
              }
            }
LAB_001029fc:
            peVar11 = a[lVar24].entry;
            pcVar12 = (char *)zip_file_get_comment(pzVar14,uVar23,&peVar11[uVar23].comment_length,0)
            ;
            peVar11[uVar23].comment = pcVar12;
            local_2120 = a[lVar24].nentry;
          }
        }
        if (paranoid == 0) {
          *local_20e0 = (char *)0x0;
          local_20e0[1] = (char *)0x0;
        }
        else {
          pcVar12 = (char *)zip_get_archive_comment(pzVar14,(stat *)e,0);
          a[lVar24].comment = pcVar12;
          a[lVar24].comment_length = (long)(int)e[0];
        }
        goto LAB_00102b70;
      }
    }
LAB_00102c88:
    zip_fclose(_stderr,"%s: malloc failure\n",progname);
    goto LAB_00102df4;
  }
  header_done = 0;
  e[0] = a[0].entry;
  e[1] = a[1].entry;
  n[0] = a[0].nentry;
  check = (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0;
  n[1] = a[1].nentry;
  if (paranoid != 0) {
    check = entry_paranoia_checks;
  }
  iVar5 = compare_list(local_20e8,e,n,0x38,entry_cmp,check,entry_print);
  if (((paranoid != 0) &&
      (iVar7 = comment_compare(a[0].comment,a[0].comment_length,a[1].comment,a[1].comment_length),
      iVar7 != 0)) && (iVar5 = 1, verbose != 0)) {
    printf("--- archive comment (%zu)\n",a[0].comment_length);
    printf("+++ archive comment (%zu)\n",a[1].comment_length);
  }
  for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
    if (a[lVar24].za != (zip_t *)0x0) {
      zip_close();
    }
    zVar27 = a[lVar24].nentry;
    peVar11 = a[lVar24].entry;
    peVar25 = peVar11;
    while (bVar28 = zVar27 != 0, zVar27 = zVar27 - 1, bVar28) {
      free(peVar25->name);
      peVar25 = peVar25 + 1;
    }
    free(peVar11);
  }
  if (iVar5 == 1) {
LAB_00102df4:
    iVar5 = 1;
  }
  else {
    if (iVar5 == 0) {
      exit(0);
    }
LAB_00102c80:
    iVar5 = 2;
  }
  exit(iVar5);
LAB_00102b03:
  iVar5 = fts_close(lVar8);
  uVar20 = _stderr;
  pcVar26 = progname;
  if (iVar5 != 0) {
    pcVar12 = a[lVar24].name;
    piVar18 = __errno_location();
    pcVar19 = strerror(*piVar18);
    pcVar21 = "%s: error closing directory \'%s\': %s\n";
LAB_00102be4:
    zip_fclose(uVar20,pcVar21,pcVar26,pcVar12,pcVar19);
    goto LAB_00102c80;
  }
  paranoid = 0;
LAB_00102b70:
  if (local_2120 != 0) {
    qsort(peVar11,local_2120,0x38,entry_cmp);
  }
  lVar24 = lVar24 + 1;
  goto LAB_0010250b;
}

Assistant:

static int
compare_zip(char *const zn[]) {
    struct archive a[2];
    struct entry *e[2];
    zip_uint64_t n[2];
    int i;
    int res;

    for (i = 0; i < 2; i++) {
	a[i].name = zn[i];
	a[i].entry = NULL;
	a[i].nentry = 0;
	a[i].za = NULL;
	a[i].comment = NULL;
	a[i].comment_length = 0;

	if (is_directory(zn[i])) {
#ifndef HAVE_FTS_H
	    fprintf(stderr, "%s: reading directories not supported\n", progname);
	    exit(2);
#else
	    if (list_directory(zn[i], a + i) < 0)
		exit(2);
	    paranoid = 0; /* paranoid checks make no sense for directories, since they compare zip metadata */
#endif
	}
	else {
	    if (list_zip(zn[i], a + i) < 0)
		exit(2);
	}
	if (a[i].nentry > 0)
	    qsort(a[i].entry, a[i].nentry, sizeof(a[i].entry[0]), entry_cmp);
    }

    header_done = 0;

    e[0] = a[0].entry;
    e[1] = a[1].entry;
    n[0] = a[0].nentry;
    n[1] = a[1].nentry;
    res = compare_list(zn, (const void **)e, n, sizeof(e[i][0]), entry_cmp, paranoid ? entry_paranoia_checks : NULL, entry_print);

    if (paranoid) {
	if (comment_compare(a[0].comment, a[0].comment_length, a[1].comment, a[1].comment_length) != 0) {
	    if (verbose) {
		printf("--- archive comment (%zu)\n", a[0].comment_length);
		printf("+++ archive comment (%zu)\n", a[1].comment_length);
	    }
	    res = 1;
	}
    }

    for (i = 0; i < 2; i++) {
	zip_uint64_t j;

	if (a[i].za) {
	    zip_close(a[i].za);
	}
	for (j = 0; j < a[i].nentry; j++) {
	    free(a[i].entry[j].name);
	}
	free(a[i].entry);
    }

    switch (res) {
    case 0:
	exit(0);

    case 1:
	exit(1);

    default:
	exit(2);
    }
}